

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::BuildAnimations
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  BaseNode *pBVar5;
  pointer pcVar6;
  pointer paVar7;
  _IEEESingle temp;
  Logger *pLVar8;
  aiAnimation **ppaVar9;
  aiAnimation *paVar10;
  aiNodeAnim **ppaVar11;
  aiNodeAnim *paVar12;
  aiVectorKey *paVar13;
  aiQuatKey *paVar14;
  ulong uVar15;
  aiQuatKey *paVar16;
  ulong uVar17;
  ulong uVar18;
  pointer ppBVar19;
  uint uVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  ppBVar19 = (nodes->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar19 ==
      (nodes->super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar18 = 0;
  }
  else {
    uVar18 = 0;
    do {
      if (((*ppBVar19)->mAnim).mPositionType != TRACK) {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"ASE: Position controller uses Bezier/TCB keys. This is not supported.")
        ;
      }
      if (((*ppBVar19)->mAnim).mRotationType != TRACK) {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"ASE: Rotation controller uses Bezier/TCB keys. This is not supported.")
        ;
      }
      if (((*ppBVar19)->mAnim).mScalingType != TRACK) {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"ASE: Position controller uses Bezier/TCB keys. This is not supported.")
        ;
      }
      pBVar5 = *ppBVar19;
      if (((1 < (ulong)(((long)(pBVar5->mAnim).akeyPositions.
                               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(pBVar5->mAnim).akeyPositions.
                               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) ||
          (1 < (ulong)(((long)(pBVar5->mAnim).akeyRotations.
                              super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pBVar5->mAnim).akeyRotations.
                              super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
         (1 < (ulong)(((long)(pBVar5->mAnim).akeyScaling.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pBVar5->mAnim).akeyScaling.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
        uVar18 = (ulong)((int)uVar18 + 1);
      }
      if (1 < (ulong)(((long)(pBVar5->mTargetAnim).akeyPositions.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pBVar5->mTargetAnim).akeyPositions.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        fVar24 = (pBVar5->mTargetPosition).x;
        uVar18 = (ulong)((int)uVar18 +
                        (uint)(((uint)fVar24 & 0x7fffff) == 0 || (~(uint)fVar24 & 0x7f800000) != 0))
        ;
      }
      ppBVar19 = ppBVar19 + 1;
    } while (ppBVar19 !=
             (nodes->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((uint)uVar18 != 0) {
    this->pcScene->mNumAnimations = 1;
    ppaVar9 = (aiAnimation **)operator_new__(8);
    this->pcScene->mAnimations = ppaVar9;
    paVar10 = (aiAnimation *)operator_new(0x448);
    (paVar10->mName).length = 0;
    (paVar10->mName).data[0] = '\0';
    memset((paVar10->mName).data + 1,0x1b,0x3ff);
    paVar10->mDuration = -1.0;
    paVar10->mTicksPerSecond = 0.0;
    paVar10->mNumChannels = 0;
    paVar10->mChannels = (aiNodeAnim **)0x0;
    paVar10->mNumMeshChannels = 0;
    paVar10->mMeshChannels = (aiMeshAnim **)0x0;
    paVar10->mNumMorphMeshChannels = 0;
    paVar10->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    *this->pcScene->mAnimations = paVar10;
    paVar10->mNumChannels = (uint)uVar18;
    ppaVar11 = (aiNodeAnim **)operator_new__(uVar18 << 3);
    paVar10->mChannels = ppaVar11;
    paVar10->mTicksPerSecond = (double)(this->mParser->iTicksPerFrame * this->mParser->iFrameSpeed);
    ppBVar19 = (nodes->
               super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar19 !=
        (nodes->
        super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar20 = 0;
      do {
        pBVar5 = *ppBVar19;
        if ((1 < (ulong)(((long)(pBVar5->mTargetAnim).akeyPositions.
                                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pBVar5->mTargetAnim).akeyPositions.
                                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                        )) &&
           (fVar24 = (pBVar5->mTargetPosition).x,
           (~(uint)fVar24 & 0x7f800000) != 0 || ((uint)fVar24 & 0x7fffff) == 0)) {
          paVar12 = (aiNodeAnim *)operator_new(0x438);
          (paVar12->mNodeName).length = 0;
          (paVar12->mNodeName).data[0] = '\0';
          memset((paVar12->mNodeName).data + 1,0x1b,0x3ff);
          paVar12->mRotationKeys = (aiQuatKey *)0x0;
          paVar12->mNumScalingKeys = 0;
          *(undefined8 *)&paVar12->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar12->mPositionKeys + 4) = 0;
          paVar12->mScalingKeys = (aiVectorKey *)0x0;
          paVar12->mPreState = aiAnimBehaviour_DEFAULT;
          paVar12->mPostState = aiAnimBehaviour_DEFAULT;
          paVar10->mChannels[uVar20] = paVar12;
          pcVar6 = (pBVar5->mName)._M_dataplus._M_p;
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar6,pcVar6 + (pBVar5->mName)._M_string_length);
          std::__cxx11::string::append((char *)&local_98);
          uVar18 = local_90;
          if (local_90 < 0x400) {
            (paVar12->mNodeName).length = (ai_uint32)local_90;
            memcpy((paVar12->mNodeName).data,local_98,local_90);
            (paVar12->mNodeName).data[uVar18] = '\0';
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          uVar17 = ((long)(pBVar5->mTargetAnim).akeyPositions.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pBVar5->mTargetAnim).akeyPositions.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          paVar12->mNumPositionKeys = (uint)uVar17;
          uVar18 = (uVar17 & 0xffffffff) * 0x18;
          paVar13 = (aiVectorKey *)operator_new__(uVar18);
          if ((uVar17 & 0xffffffff) != 0) {
            uVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar13->mTime + uVar15);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar13->mValue).z + uVar15) = 0;
              uVar15 = uVar15 + 0x18;
            } while (uVar18 != uVar15);
          }
          uVar20 = uVar20 + 1;
          paVar12->mPositionKeys = paVar13;
          memcpy(paVar13,(pBVar5->mTargetAnim).akeyPositions.
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start,(uVar17 & 0xffffffff) * 0x18);
        }
        if (((1 < (ulong)(((long)(pBVar5->mAnim).akeyPositions.
                                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pBVar5->mAnim).akeyPositions.
                                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) ||
            (1 < (ulong)(((long)(pBVar5->mAnim).akeyRotations.
                                super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(pBVar5->mAnim).akeyRotations.
                                super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) ||
           (1 < (ulong)(((long)(pBVar5->mAnim).akeyScaling.
                               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(pBVar5->mAnim).akeyScaling.
                               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
          paVar12 = (aiNodeAnim *)operator_new(0x438);
          (paVar12->mNodeName).length = 0;
          (paVar12->mNodeName).data[0] = '\0';
          memset((paVar12->mNodeName).data + 1,0x1b,0x3ff);
          paVar12->mRotationKeys = (aiQuatKey *)0x0;
          paVar12->mNumScalingKeys = 0;
          *(undefined8 *)&paVar12->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar12->mPositionKeys + 4) = 0;
          paVar12->mScalingKeys = (aiVectorKey *)0x0;
          paVar12->mPreState = aiAnimBehaviour_DEFAULT;
          paVar12->mPostState = aiAnimBehaviour_DEFAULT;
          paVar10->mChannels[uVar20] = paVar12;
          uVar18 = (pBVar5->mName)._M_string_length;
          if (uVar18 < 0x400) {
            (paVar12->mNodeName).length = (ai_uint32)uVar18;
            memcpy((paVar12->mNodeName).data,(pBVar5->mName)._M_dataplus._M_p,uVar18);
            (paVar12->mNodeName).data[uVar18] = '\0';
          }
          uVar18 = ((long)(pBVar5->mAnim).akeyPositions.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pBVar5->mAnim).akeyPositions.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          if (1 < uVar18) {
            paVar12->mNumPositionKeys = (uint)uVar18;
            uVar17 = (uVar18 & 0xffffffff) * 0x18;
            paVar13 = (aiVectorKey *)operator_new__(uVar17);
            if ((uVar18 & 0xffffffff) != 0) {
              uVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)&paVar13->mTime + uVar15);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)&(paVar13->mValue).z + uVar15) = 0;
                uVar15 = uVar15 + 0x18;
              } while (uVar17 != uVar15);
            }
            paVar12->mPositionKeys = paVar13;
            memcpy(paVar13,(pBVar5->mAnim).akeyPositions.
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start,(uVar18 & 0xffffffff) * 0x18);
          }
          uVar18 = ((long)(pBVar5->mAnim).akeyRotations.
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pBVar5->mAnim).akeyRotations.
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          if (1 < uVar18) {
            paVar12->mNumRotationKeys = (uint)uVar18;
            uVar18 = uVar18 & 0xffffffff;
            paVar14 = (aiQuatKey *)operator_new__(uVar18 * 0x18);
            if (uVar18 != 0) {
              paVar16 = paVar14;
              do {
                paVar16->mTime = 0.0;
                (paVar16->mValue).w = 1.0;
                (paVar16->mValue).x = 0.0;
                (paVar16->mValue).y = 0.0;
                (paVar16->mValue).z = 0.0;
                paVar16 = paVar16 + 1;
              } while (paVar16 != paVar14 + uVar18);
            }
            paVar12->mRotationKeys = paVar14;
            if (paVar12->mNumRotationKeys != 0) {
              fVar22 = 0.0;
              fVar23 = 0.0;
              lVar21 = 0;
              uVar18 = 0;
              fVar24 = 1.0;
              fVar25 = 0.0;
              do {
                paVar7 = (pBVar5->mAnim).akeyRotations.
                         super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar3 = *(undefined8 *)((long)&paVar7->mTime + lVar21);
                uVar4 = *(undefined8 *)((long)&(paVar7->mValue).w + lVar21);
                fVar28 = (float)uVar4;
                fVar33 = (float)((ulong)uVar4 >> 0x20);
                uVar4 = *(undefined8 *)((long)&(paVar7->mValue).y + lVar21);
                fVar31 = (float)uVar4;
                fVar27 = (float)((ulong)uVar4 >> 0x20);
                if (0x6e < this->mParser->iFileFormat) {
                  fVar30 = fVar33;
                  fVar26 = 0.0;
                  fVar29 = 0.0;
                  if (lVar21 != 0) {
                    fVar30 = fVar25 * fVar28;
                    fVar32 = fVar22 * fVar28;
                    fVar29 = fVar23 * fVar28;
                    fVar26 = fVar25 * fVar31;
                    fVar28 = ((fVar24 * fVar28 - fVar33 * fVar25) - fVar22 * fVar31) -
                             fVar23 * fVar27;
                    fVar30 = (fVar22 * fVar27 + fVar24 * fVar33 + fVar30) - fVar23 * fVar31;
                    fVar31 = (fVar23 * fVar33 + fVar24 * fVar31 + fVar32) - fVar25 * fVar27;
                    fVar27 = (fVar26 + fVar27 * fVar24 + fVar29) - fVar33 * fVar22;
                    fVar26 = fVar23;
                    fVar29 = fVar25;
                  }
                  fVar32 = fVar28 * fVar28 + fVar27 * fVar27 + fVar30 * fVar30 + fVar31 * fVar31;
                  if (fVar32 < 0.0) {
                    local_78 = fVar27;
                    fStack_74 = fVar27;
                    fStack_70 = fVar27;
                    fStack_6c = fVar27;
                    local_68 = fVar30;
                    fStack_64 = fVar30;
                    fStack_60 = fVar30;
                    fStack_5c = fVar30;
                    local_58 = fVar28;
                    fStack_54 = fVar30;
                    fStack_50 = fVar29;
                    fStack_4c = fVar26;
                    local_48 = fVar31;
                    fStack_44 = fVar27;
                    fStack_40 = fVar26;
                    fStack_3c = fVar29;
                    fVar32 = sqrtf(fVar32);
                    fVar30 = local_68;
                    fVar26 = local_78;
                    fVar24 = local_58;
                    fVar25 = fStack_54;
                    fVar22 = local_48;
                    fVar23 = fStack_44;
                  }
                  else {
                    fVar32 = SQRT(fVar32);
                    fVar26 = fVar27;
                    fVar24 = fVar28;
                    fVar25 = fVar30;
                    fVar22 = fVar31;
                    fVar23 = fVar27;
                  }
                  if ((fVar32 != 0.0) ||
                     (fVar28 = fVar24, fVar33 = fVar25, fVar31 = fVar22, fVar27 = fVar23,
                     NAN(fVar32))) {
                    fVar32 = 1.0 / fVar32;
                    fVar25 = fVar30 * fVar32;
                    fVar22 = fVar22 * fVar32;
                    fVar23 = fVar26 * fVar32;
                    fVar24 = fVar24 * fVar32;
                    fVar28 = fVar24;
                    fVar33 = fVar25;
                    fVar31 = fVar22;
                    fVar27 = fVar23;
                  }
                }
                paVar14 = paVar12->mRotationKeys;
                *(undefined8 *)((long)&paVar14->mTime + lVar21) = uVar3;
                pfVar2 = (float *)((long)&(paVar14->mValue).w + lVar21);
                *pfVar2 = fVar28;
                pfVar2[1] = fVar33;
                pfVar2[2] = fVar31;
                pfVar2[3] = fVar27;
                *(uint *)((long)&(paVar12->mRotationKeys->mValue).w + lVar21) =
                     *(uint *)((long)&(paVar12->mRotationKeys->mValue).w + lVar21) ^ 0x80000000;
                uVar18 = uVar18 + 1;
                lVar21 = lVar21 + 0x18;
              } while (uVar18 < paVar12->mNumRotationKeys);
            }
          }
          uVar20 = uVar20 + 1;
          uVar18 = ((long)(pBVar5->mAnim).akeyScaling.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pBVar5->mAnim).akeyScaling.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          if (1 < uVar18) {
            paVar12->mNumScalingKeys = (uint)uVar18;
            uVar17 = (uVar18 & 0xffffffff) * 0x18;
            paVar13 = (aiVectorKey *)operator_new__(uVar17);
            if ((uVar18 & 0xffffffff) != 0) {
              uVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)&paVar13->mTime + uVar15);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined4 *)((long)&(paVar13->mValue).z + uVar15) = 0;
                uVar15 = uVar15 + 0x18;
              } while (uVar17 != uVar15);
            }
            paVar12->mScalingKeys = paVar13;
            memcpy(paVar13,(pBVar5->mAnim).akeyScaling.
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start,(uVar18 & 0xffffffff) * 0x18);
          }
        }
        ppBVar19 = ppBVar19 + 1;
      } while (ppBVar19 !=
               (nodes->
               super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildAnimations(const std::vector<BaseNode*>& nodes)
{
    // check whether we have at least one mesh which has animations
    std::vector<ASE::BaseNode*>::const_iterator i =  nodes.begin();
    unsigned int iNum = 0;
    for (;i != nodes.end();++i) {

        // TODO: Implement Bezier & TCB support
        if ((*i)->mAnim.mPositionType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mRotationType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Rotation controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mScalingType != ASE::Animation::TRACK)  {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }

        // We compare against 1 here - firstly one key is not
        // really an animation and secondly MAX writes dummies
        // that represent the node transformation.
        if ((*i)->mAnim.akeyPositions.size()>1 || (*i)->mAnim.akeyRotations.size()>1 || (*i)->mAnim.akeyScaling.size()>1){
            ++iNum;
        }
        if ((*i)->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( (*i)->mTargetPosition.x )) {
            ++iNum;
        }
    }
    if (iNum)   {
        // Generate a new animation channel and setup everything for it
        pcScene->mNumAnimations = 1;
        pcScene->mAnimations    = new aiAnimation*[1];
        aiAnimation* pcAnim     = pcScene->mAnimations[0] = new aiAnimation();
        pcAnim->mNumChannels    = iNum;
        pcAnim->mChannels       = new aiNodeAnim*[iNum];
        pcAnim->mTicksPerSecond = mParser->iFrameSpeed * mParser->iTicksPerFrame;

        iNum = 0;

        // Now iterate through all meshes and collect all data we can find
        for (i =  nodes.begin();i != nodes.end();++i)   {

            ASE::BaseNode* me = *i;
            if ( me->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( me->mTargetPosition.x ))  {
                // Generate an extra channel for the camera/light target.
                // BuildNodes() does also generate an extra node, named
                // <baseName>.Target.
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName + ".Target");

                // If there is no input position channel we will need
                // to supply the default position from the node's
                // local transformation matrix.
                /*TargetAnimationHelper helper;
                if (me->mAnim.akeyPositions.empty())
                {
                    aiMatrix4x4& mat = (*i)->mTransform;
                    helper.SetFixedMainAnimationChannel(aiVector3D(
                        mat.a4, mat.b4, mat.c4));
                }
                else helper.SetMainAnimationChannel (&me->mAnim.akeyPositions);
                helper.SetTargetAnimationChannel (&me->mTargetAnim.akeyPositions);

                helper.Process(&me->mTargetAnim.akeyPositions);*/

                // Allocate the key array and fill it
                nd->mNumPositionKeys = (unsigned int) me->mTargetAnim.akeyPositions.size();
                nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                ::memcpy(nd->mPositionKeys,&me->mTargetAnim.akeyPositions[0],
                    nd->mNumPositionKeys * sizeof(aiVectorKey));
            }

            if (me->mAnim.akeyPositions.size() > 1 || me->mAnim.akeyRotations.size() > 1 || me->mAnim.akeyScaling.size() > 1)   {
                // Begin a new node animation channel for this node
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName);

                // copy position keys
                if (me->mAnim.akeyPositions.size() > 1 )
                {
                    // Allocate the key array and fill it
                    nd->mNumPositionKeys = (unsigned int) me->mAnim.akeyPositions.size();
                    nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                    ::memcpy(nd->mPositionKeys,&me->mAnim.akeyPositions[0],
                        nd->mNumPositionKeys * sizeof(aiVectorKey));
                }
                // copy rotation keys
                if (me->mAnim.akeyRotations.size() > 1 )    {
                    // Allocate the key array and fill it
                    nd->mNumRotationKeys = (unsigned int) me->mAnim.akeyRotations.size();
                    nd->mRotationKeys = new aiQuatKey[nd->mNumRotationKeys];

                    // --------------------------------------------------------------------
                    // Rotation keys are offsets to the previous keys.
                    // We have the quaternion representations of all
                    // of them, so we just need to concatenate all
                    // (unit-length) quaternions to get the absolute
                    // rotations.
                    // Rotation keys are ABSOLUTE for older files
                    // --------------------------------------------------------------------

                    aiQuaternion cur;
                    for (unsigned int a = 0; a < nd->mNumRotationKeys;++a)  {
                        aiQuatKey q = me->mAnim.akeyRotations[a];

                        if (mParser->iFileFormat > 110) {
                            cur = (a ? cur*q.mValue : q.mValue);
                            q.mValue = cur.Normalize();
                        }
                        nd->mRotationKeys[a] = q;

                        // need this to get to Assimp quaternion conventions
                        nd->mRotationKeys[a].mValue.w *= -1.f;
                    }
                }
                // copy scaling keys
                if (me->mAnim.akeyScaling.size() > 1 )  {
                    // Allocate the key array and fill it
                    nd->mNumScalingKeys = (unsigned int) me->mAnim.akeyScaling.size();
                    nd->mScalingKeys = new aiVectorKey[nd->mNumScalingKeys];

                    ::memcpy(nd->mScalingKeys,&me->mAnim.akeyScaling[0],
                        nd->mNumScalingKeys * sizeof(aiVectorKey));
                }
            }
        }
    }
}